

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_debug_seq_parameter_set_rbsp(sps_t *sps,bs_t *b)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint32_t r;
  uint uVar9;
  ulong uVar10;
  uint32_t r_1;
  ulong uVar11;
  long lVar12;
  int iVar13;
  FILE *pFVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  
  memset(sps,0,0x1028);
  sps->chroma_format_idc = 1;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar6 = b->bits_left;
  if ((uVar6 == 8) && (pbVar4 = b->p, pbVar4 < b->end)) {
    uVar5 = (uint)*pbVar4;
    b->p = pbVar4 + 1;
  }
  else {
    pbVar4 = b->p;
    uVar5 = 0;
    iVar7 = 7;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      uVar9 = 0;
      if (pbVar4 < b->end) {
        uVar9 = (uint)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
      }
      if (uVar6 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar5 = uVar5 | uVar9 << ((byte)iVar7 & 0x1f);
      bVar20 = iVar7 != 0;
      iVar7 = iVar7 + -1;
    } while (bVar20);
  }
  sps->profile_idc = uVar5;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  uVar6 = 0;
  fprintf(pFVar14,"sps->profile_idc: %d \n");
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar5 = b->bits_left - 1;
  b->bits_left = uVar5;
  pbVar4 = b->p;
  if (pbVar4 < b->end) {
    uVar6 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps->constraint_set0_flag = uVar6;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  uVar5 = 0;
  fprintf(pFVar14,"sps->constraint_set0_flag: %d \n",(ulong)uVar6);
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar6 = b->bits_left - 1;
  b->bits_left = uVar6;
  pbVar4 = b->p;
  if (pbVar4 < b->end) {
    uVar5 = (uint)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
  }
  if (uVar6 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps->constraint_set1_flag = uVar5;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  uVar6 = 0;
  fprintf(pFVar14,"sps->constraint_set1_flag: %d \n",(ulong)uVar5);
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar5 = b->bits_left - 1;
  b->bits_left = uVar5;
  pbVar4 = b->p;
  if (pbVar4 < b->end) {
    uVar6 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps->constraint_set2_flag = uVar6;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  uVar5 = 0;
  fprintf(pFVar14,"sps->constraint_set2_flag: %d \n",(ulong)uVar6);
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar6 = b->bits_left - 1;
  b->bits_left = uVar6;
  pbVar4 = b->p;
  if (pbVar4 < b->end) {
    uVar5 = (uint)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
  }
  if (uVar6 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps->constraint_set3_flag = uVar5;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  uVar6 = 0;
  fprintf(pFVar14,"sps->constraint_set3_flag: %d \n",(ulong)uVar5);
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar5 = b->bits_left - 1;
  b->bits_left = uVar5;
  pbVar4 = b->p;
  if (pbVar4 < b->end) {
    uVar6 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps->constraint_set4_flag = uVar6;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  uVar10 = 0;
  fprintf(pFVar14,"sps->constraint_set4_flag: %d \n",(ulong)uVar6);
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar6 = b->bits_left - 1;
  b->bits_left = uVar6;
  pbVar4 = b->p;
  if (pbVar4 < b->end) {
    uVar10 = (ulong)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
  }
  if (uVar6 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps->constraint_set5_flag = (int)uVar10;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  uVar11 = 0;
  fprintf(pFVar14,"sps->constraint_set5_flag: %d \n",uVar10);
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar4 = b->p;
  uVar6 = b->bits_left;
  iVar7 = 1;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    uVar5 = 0;
    if (pbVar4 < b->end) {
      uVar5 = (uint)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
    }
    if (uVar6 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar11 = (ulong)((uint)uVar11 | uVar5 << ((byte)iVar7 & 0x1f));
    bVar20 = iVar7 != 0;
    iVar7 = iVar7 + -1;
  } while (bVar20);
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"reserved_zero_2bits: %d \n",uVar11);
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar6 = b->bits_left;
  if ((uVar6 == 8) && (pbVar4 = b->p, pbVar4 < b->end)) {
    uVar5 = (uint)*pbVar4;
    b->p = pbVar4 + 1;
  }
  else {
    pbVar4 = b->p;
    uVar5 = 0;
    iVar7 = 7;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      uVar9 = 0;
      if (pbVar4 < b->end) {
        uVar9 = (uint)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
      }
      if (uVar6 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar5 = uVar5 | uVar9 << ((byte)iVar7 & 0x1f);
      bVar20 = iVar7 != 0;
      iVar7 = iVar7 + -1;
    } while (bVar20);
  }
  sps->level_idc = uVar5;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  iVar7 = 0;
  fprintf(pFVar14,"sps->level_idc: %d \n");
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar4 = b->p;
  pbVar1 = b->end;
  uVar6 = b->bits_left;
  uVar5 = 0xffffffff;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar20 = true;
    if (pbVar4 < pbVar1) {
      bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
  if (iVar7 == -1) {
    uVar6 = 0;
  }
  else {
    iVar8 = -2 - iVar7;
    iVar13 = -3 - iVar7;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    uVar6 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar9 = 0;
      if (pbVar4 < pbVar1) {
        uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar13 != -2);
  }
  sps->seq_parameter_set_id = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"sps->seq_parameter_set_id: %d \n");
  iVar7 = sps->profile_idc;
  if ((((iVar7 - 0x53U < 0x39) && ((0x188208808020009U >> ((ulong)(iVar7 - 0x53U) & 0x3f) & 1) != 0)
       ) || (iVar7 == 0xf4)) || (iVar7 == 0x2c)) {
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    iVar7 = 0;
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar1 = b->end;
    uVar6 = b->bits_left;
    uVar5 = 0xffffffff;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      bVar20 = true;
      if (pbVar4 < pbVar1) {
        bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
      }
      if (uVar6 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar7 == -1) {
      uVar6 = 0;
    }
    else {
      iVar8 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar6 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar1) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar13 != -2);
    }
    sps->chroma_format_idc = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"sps->chroma_format_idc: %d \n");
    if (sps->chroma_format_idc == 3) {
      pFVar14 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar14 = _stdout;
      }
      uVar10 = 0;
      fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar6 = b->bits_left - 1;
      b->bits_left = uVar6;
      pbVar4 = b->p;
      if (pbVar4 < b->end) {
        uVar10 = (ulong)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
      }
      if (uVar6 == 0) {
        b->p = pbVar4 + 1;
        b->bits_left = 8;
      }
      sps->residual_colour_transform_flag = (int)uVar10;
      pFVar14 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar14 = _stdout;
      }
      fprintf(pFVar14,"sps->residual_colour_transform_flag: %d \n",uVar10);
    }
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    iVar7 = 0;
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar1 = b->end;
    uVar6 = b->bits_left;
    uVar5 = 0xffffffff;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      bVar20 = true;
      if (pbVar4 < pbVar1) {
        bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
      }
      if (uVar6 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar7 == -1) {
      uVar6 = 0;
    }
    else {
      iVar8 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar6 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar1) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar13 != -2);
    }
    uVar5 = 0xffffffff;
    sps->bit_depth_luma_minus8 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    iVar7 = 0;
    fprintf(pFVar14,"sps->bit_depth_luma_minus8: %d \n");
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar1 = b->end;
    uVar6 = b->bits_left;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      bVar20 = true;
      if (pbVar4 < pbVar1) {
        bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
      }
      if (uVar6 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar7 == -1) {
      uVar6 = 0;
    }
    else {
      iVar8 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar6 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar1) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar13 != -2);
    }
    sps->bit_depth_chroma_minus8 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    uVar10 = 0;
    fprintf(pFVar14,"sps->bit_depth_chroma_minus8: %d \n");
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar6 = b->bits_left - 1;
    b->bits_left = uVar6;
    pbVar4 = b->p;
    if (pbVar4 < b->end) {
      uVar10 = (ulong)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
    }
    if (uVar6 == 0) {
      b->p = pbVar4 + 1;
      b->bits_left = 8;
    }
    sps->qpprime_y_zero_transform_bypass_flag = (int)uVar10;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    uVar11 = 0;
    fprintf(pFVar14,"sps->qpprime_y_zero_transform_bypass_flag: %d \n",uVar10);
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar6 = b->bits_left - 1;
    b->bits_left = uVar6;
    pbVar4 = b->p;
    if (pbVar4 < b->end) {
      uVar11 = (ulong)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
    }
    if (uVar6 == 0) {
      b->p = pbVar4 + 1;
      b->bits_left = 8;
    }
    sps->seq_scaling_matrix_present_flag = (int)uVar11;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"sps->seq_scaling_matrix_present_flag: %d \n",uVar11);
    if (sps->seq_scaling_matrix_present_flag != 0) {
      lVar12 = 0x1f0;
      lVar18 = 0x70;
      lVar19 = 0x7f0;
      lVar17 = -0x3f8;
      uVar10 = 0;
      do {
        pFVar14 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar14 = _stdout;
        }
        uVar5 = 0;
        fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar6 = b->bits_left - 1;
        b->bits_left = uVar6;
        pbVar4 = b->p;
        if (pbVar4 < b->end) {
          uVar5 = (uint)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
        }
        if (uVar6 == 0) {
          b->p = pbVar4 + 1;
          b->bits_left = 8;
        }
        sps->seq_scaling_list_present_flag[uVar10] = uVar5;
        pFVar14 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar14 = _stdout;
        }
        fprintf(pFVar14,"sps->seq_scaling_list_present_flag[ i ]: %d \n",(ulong)uVar5);
        if (sps->seq_scaling_list_present_flag[uVar10] != 0) {
          if (uVar10 < 6) {
            iVar7 = 0x10;
            lVar2 = lVar12;
            lVar3 = lVar18;
          }
          else {
            iVar7 = 0x40;
            lVar2 = lVar19;
            lVar3 = lVar17;
          }
          read_debug_scaling_list
                    (b,(int *)((long)sps->seq_scaling_list_present_flag + lVar3 + -0x40),iVar7,
                     (int *)((long)sps->seq_scaling_list_present_flag + lVar2 + -0x40));
        }
        uVar10 = uVar10 + 1;
        lVar12 = lVar12 + 4;
        lVar18 = lVar18 + 0x40;
        lVar19 = lVar19 + 4;
        lVar17 = lVar17 + 0x100;
      } while (uVar10 != 8);
    }
  }
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  iVar7 = 0;
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar4 = b->p;
  pbVar1 = b->end;
  uVar6 = b->bits_left;
  uVar5 = 0xffffffff;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar20 = true;
    if (pbVar4 < pbVar1) {
      bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
  if (iVar7 == -1) {
    uVar6 = 0;
  }
  else {
    iVar8 = -2 - iVar7;
    iVar13 = -3 - iVar7;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    uVar6 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar9 = 0;
      if (pbVar4 < pbVar1) {
        uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar13 != -2);
  }
  uVar5 = 0xffffffff;
  sps->log2_max_frame_num_minus4 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  iVar7 = 0;
  fprintf(pFVar14,"sps->log2_max_frame_num_minus4: %d \n");
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar4 = b->p;
  pbVar1 = b->end;
  uVar6 = b->bits_left;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar20 = true;
    if (pbVar4 < pbVar1) {
      bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
  if (iVar7 == -1) {
    uVar6 = 0;
  }
  else {
    iVar8 = -2 - iVar7;
    iVar13 = -3 - iVar7;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    uVar6 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar9 = 0;
      if (pbVar4 < pbVar1) {
        uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar13 != -2);
  }
  sps->pic_order_cnt_type = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"sps->pic_order_cnt_type: %d \n");
  if (sps->pic_order_cnt_type == 1) {
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    uVar5 = 0;
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar6 = b->bits_left - 1;
    b->bits_left = uVar6;
    pbVar4 = b->p;
    if (pbVar4 < b->end) {
      uVar5 = (uint)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
    }
    if (uVar6 == 0) {
      b->p = pbVar4 + 1;
      b->bits_left = 8;
    }
    sps->delta_pic_order_always_zero_flag = uVar5;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    iVar7 = 0;
    fprintf(pFVar14,"sps->delta_pic_order_always_zero_flag: %d \n",(ulong)uVar5);
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar1 = b->end;
    uVar6 = b->bits_left;
    uVar5 = 0xffffffff;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      bVar20 = true;
      if (pbVar4 < pbVar1) {
        bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
      }
      if (uVar6 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar7 == -1) {
      uVar6 = 0;
    }
    else {
      iVar8 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar6 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar1) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar13 != -2);
    }
    uVar9 = -1 << (~(byte)iVar7 & 0x1f);
    uVar5 = ~uVar9 + uVar6;
    iVar7 = -((int)uVar5 >> 1);
    if ((uVar5 & 1) != 0) {
      iVar7 = (int)(uVar6 - uVar9) >> 1;
    }
    uVar6 = 0xffffffff;
    sps->offset_for_non_ref_pic = iVar7;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    iVar7 = 0;
    fprintf(pFVar14,"sps->offset_for_non_ref_pic: %d \n");
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar1 = b->end;
    uVar5 = b->bits_left;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar20 = true;
      if (pbVar4 < pbVar1) {
        bVar20 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar6 = uVar6 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar20 & uVar6 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar7 == -1) {
      uVar6 = 0;
    }
    else {
      iVar8 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar6 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar1) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar13 != -2);
    }
    uVar9 = -1 << (~(byte)iVar7 & 0x1f);
    uVar5 = ~uVar9 + uVar6;
    iVar7 = -((int)uVar5 >> 1);
    if ((uVar5 & 1) != 0) {
      iVar7 = (int)(uVar6 - uVar9) >> 1;
    }
    uVar6 = 0xffffffff;
    sps->offset_for_top_to_bottom_field = iVar7;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    iVar7 = 0;
    fprintf(pFVar14,"sps->offset_for_top_to_bottom_field: %d \n");
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar1 = b->end;
    uVar5 = b->bits_left;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar20 = true;
      if (pbVar4 < pbVar1) {
        bVar20 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar6 = uVar6 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar20 & uVar6 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar7 == -1) {
      uVar6 = 0;
    }
    else {
      iVar8 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar6 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar1) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar13 != -2);
    }
    sps->num_ref_frames_in_pic_order_cnt_cycle = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"sps->num_ref_frames_in_pic_order_cnt_cycle: %d \n");
    if (0 < sps->num_ref_frames_in_pic_order_cnt_cycle) {
      lVar12 = 0;
      do {
        pFVar14 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar14 = _stdout;
        }
        fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        pbVar4 = b->p;
        pbVar1 = b->end;
        uVar6 = b->bits_left;
        uVar5 = 0xffffffff;
        iVar7 = -2;
        do {
          iVar8 = iVar7;
          uVar9 = uVar5;
          uVar6 = uVar6 - 1;
          b->bits_left = uVar6;
          bVar20 = true;
          if (pbVar4 < pbVar1) {
            bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
          }
          if (uVar6 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar6 = 8;
          }
          uVar5 = uVar9 + 1;
        } while (((bool)(bVar20 & uVar5 < 0x20)) && (iVar7 = iVar8 + 1, pbVar4 < pbVar1));
        if (uVar5 == 0) {
          uVar6 = 0;
        }
        else {
          uVar15 = b->bits_left;
          pbVar4 = b->p;
          uVar6 = 0;
          do {
            uVar15 = uVar15 - 1;
            b->bits_left = uVar15;
            uVar16 = 0;
            if (pbVar4 < pbVar1) {
              uVar16 = (uint)((*pbVar4 >> (uVar15 & 0x1f) & 1) != 0);
            }
            if (uVar15 == 0) {
              pbVar4 = pbVar4 + 1;
              b->p = pbVar4;
              b->bits_left = 8;
              uVar15 = 8;
            }
            uVar6 = uVar6 | uVar16 << ((byte)uVar9 & 0x1f);
            uVar9 = uVar9 - 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != -2);
        }
        uVar9 = -1 << ((byte)uVar5 & 0x1f);
        uVar5 = ~uVar9 + uVar6;
        iVar7 = -((int)uVar5 >> 1);
        if ((uVar5 & 1) != 0) {
          iVar7 = (int)(uVar6 - uVar9) >> 1;
        }
        sps->offset_for_ref_frame[lVar12] = iVar7;
        pFVar14 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar14 = _stdout;
        }
        fprintf(pFVar14,"sps->offset_for_ref_frame[ i ]: %d \n");
        lVar12 = lVar12 + 1;
      } while (lVar12 < sps->num_ref_frames_in_pic_order_cnt_cycle);
    }
  }
  else if (sps->pic_order_cnt_type == 0) {
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    iVar7 = 0;
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar1 = b->end;
    uVar6 = b->bits_left;
    uVar5 = 0xffffffff;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      bVar20 = true;
      if (pbVar4 < pbVar1) {
        bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
      }
      if (uVar6 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar7 == -1) {
      uVar6 = 0;
    }
    else {
      iVar8 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar6 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar1) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar13 != -2);
    }
    sps->log2_max_pic_order_cnt_lsb_minus4 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"sps->log2_max_pic_order_cnt_lsb_minus4: %d \n");
  }
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  iVar7 = 0;
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar4 = b->p;
  pbVar1 = b->end;
  uVar6 = b->bits_left;
  uVar5 = 0xffffffff;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar20 = true;
    if (pbVar4 < pbVar1) {
      bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
  if (iVar7 == -1) {
    uVar6 = 0;
  }
  else {
    iVar8 = -2 - iVar7;
    iVar13 = -3 - iVar7;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    uVar6 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar9 = 0;
      if (pbVar4 < pbVar1) {
        uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar13 != -2);
  }
  sps->num_ref_frames = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  uVar6 = 0;
  fprintf(pFVar14,"sps->num_ref_frames: %d \n");
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar5 = b->bits_left - 1;
  b->bits_left = uVar5;
  pbVar4 = b->p;
  if (pbVar4 < b->end) {
    uVar6 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps->gaps_in_frame_num_value_allowed_flag = uVar6;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  iVar7 = 0;
  fprintf(pFVar14,"sps->gaps_in_frame_num_value_allowed_flag: %d \n",(ulong)uVar6);
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar4 = b->p;
  pbVar1 = b->end;
  uVar6 = b->bits_left;
  uVar5 = 0xffffffff;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar20 = true;
    if (pbVar4 < pbVar1) {
      bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
  if (iVar7 == -1) {
    uVar6 = 0;
  }
  else {
    iVar8 = -2 - iVar7;
    iVar13 = -3 - iVar7;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    uVar6 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar9 = 0;
      if (pbVar4 < pbVar1) {
        uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar13 != -2);
  }
  uVar5 = 0xffffffff;
  sps->pic_width_in_mbs_minus1 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  iVar7 = 0;
  fprintf(pFVar14,"sps->pic_width_in_mbs_minus1: %d \n");
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar4 = b->p;
  pbVar1 = b->end;
  uVar6 = b->bits_left;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar20 = true;
    if (pbVar4 < pbVar1) {
      bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
  if (iVar7 == -1) {
    uVar6 = 0;
  }
  else {
    iVar8 = -2 - iVar7;
    iVar13 = -3 - iVar7;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    uVar6 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar9 = 0;
      if (pbVar4 < pbVar1) {
        uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar13 != -2);
  }
  sps->pic_height_in_map_units_minus1 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  uVar10 = 0;
  fprintf(pFVar14,"sps->pic_height_in_map_units_minus1: %d \n");
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar6 = b->bits_left - 1;
  b->bits_left = uVar6;
  pbVar4 = b->p;
  if (pbVar4 < b->end) {
    uVar10 = (ulong)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
  }
  if (uVar6 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps->frame_mbs_only_flag = (int)uVar10;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"sps->frame_mbs_only_flag: %d \n",uVar10);
  if (sps->frame_mbs_only_flag == 0) {
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    uVar10 = 0;
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar6 = b->bits_left - 1;
    b->bits_left = uVar6;
    pbVar4 = b->p;
    if (pbVar4 < b->end) {
      uVar10 = (ulong)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
    }
    if (uVar6 == 0) {
      b->p = pbVar4 + 1;
      b->bits_left = 8;
    }
    sps->mb_adaptive_frame_field_flag = (int)uVar10;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"sps->mb_adaptive_frame_field_flag: %d \n",uVar10);
  }
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  uVar5 = 0;
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar6 = b->bits_left - 1;
  b->bits_left = uVar6;
  pbVar4 = b->p;
  if (pbVar4 < b->end) {
    uVar5 = (uint)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
  }
  if (uVar6 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps->direct_8x8_inference_flag = uVar5;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  uVar10 = 0;
  fprintf(pFVar14,"sps->direct_8x8_inference_flag: %d \n",(ulong)uVar5);
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar6 = b->bits_left - 1;
  b->bits_left = uVar6;
  pbVar4 = b->p;
  if (pbVar4 < b->end) {
    uVar10 = (ulong)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
  }
  if (uVar6 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps->frame_cropping_flag = (int)uVar10;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"sps->frame_cropping_flag: %d \n",uVar10);
  if (sps->frame_cropping_flag != 0) {
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    iVar7 = 0;
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar1 = b->end;
    uVar6 = b->bits_left;
    uVar5 = 0xffffffff;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      bVar20 = true;
      if (pbVar4 < pbVar1) {
        bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
      }
      if (uVar6 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar7 == -1) {
      uVar6 = 0;
    }
    else {
      iVar8 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar6 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar1) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar13 != -2);
    }
    uVar5 = 0xffffffff;
    sps->frame_crop_left_offset = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    iVar7 = 0;
    fprintf(pFVar14,"sps->frame_crop_left_offset: %d \n");
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar1 = b->end;
    uVar6 = b->bits_left;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      bVar20 = true;
      if (pbVar4 < pbVar1) {
        bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
      }
      if (uVar6 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar7 == -1) {
      uVar6 = 0;
    }
    else {
      iVar8 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar6 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar1) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar13 != -2);
    }
    uVar5 = 0xffffffff;
    sps->frame_crop_right_offset = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    iVar7 = 0;
    fprintf(pFVar14,"sps->frame_crop_right_offset: %d \n");
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar1 = b->end;
    uVar6 = b->bits_left;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      bVar20 = true;
      if (pbVar4 < pbVar1) {
        bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
      }
      if (uVar6 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar7 == -1) {
      uVar6 = 0;
    }
    else {
      iVar8 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar6 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar1) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar13 != -2);
    }
    uVar5 = 0xffffffff;
    sps->frame_crop_top_offset = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    iVar7 = 0;
    fprintf(pFVar14,"sps->frame_crop_top_offset: %d \n");
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar1 = b->end;
    uVar6 = b->bits_left;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      bVar20 = true;
      if (pbVar4 < pbVar1) {
        bVar20 = (*pbVar4 >> (uVar6 & 0x1f) & 1) == 0;
      }
      if (uVar6 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar20 & uVar5 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar7 == -1) {
      uVar6 = 0;
    }
    else {
      iVar8 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar6 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar1) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar6 = uVar6 | uVar9 << ((byte)iVar8 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar13 != -2);
    }
    sps->frame_crop_bottom_offset = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar6;
    pFVar14 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar14 = _stdout;
    }
    fprintf(pFVar14,"sps->frame_crop_bottom_offset: %d \n");
  }
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  uVar5 = 0;
  fprintf(pFVar14,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar6 = b->bits_left - 1;
  b->bits_left = uVar6;
  pbVar4 = b->p;
  if (pbVar4 < b->end) {
    uVar5 = (uint)((*pbVar4 >> (uVar6 & 0x1f) & 1) != 0);
  }
  if (uVar6 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps->vui_parameters_present_flag = uVar5;
  pFVar14 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar14 = _stdout;
  }
  fprintf(pFVar14,"sps->vui_parameters_present_flag: %d \n",(ulong)uVar5);
  if (sps->vui_parameters_present_flag == 0) {
    return;
  }
  read_debug_vui_parameters(sps,b);
  return;
}

Assistant:

void read_debug_seq_parameter_set_rbsp(sps_t* sps, bs_t* b)
{
    int i;

    if( 1 )
    {
        memset(sps, 0, sizeof(sps_t));
        sps->chroma_format_idc = 1; 
    }
 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->profile_idc = bs_read_u8(b); printf("sps->profile_idc: %d \n", sps->profile_idc); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set0_flag = bs_read_u1(b); printf("sps->constraint_set0_flag: %d \n", sps->constraint_set0_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set1_flag = bs_read_u1(b); printf("sps->constraint_set1_flag: %d \n", sps->constraint_set1_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set2_flag = bs_read_u1(b); printf("sps->constraint_set2_flag: %d \n", sps->constraint_set2_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set3_flag = bs_read_u1(b); printf("sps->constraint_set3_flag: %d \n", sps->constraint_set3_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set4_flag = bs_read_u1(b); printf("sps->constraint_set4_flag: %d \n", sps->constraint_set4_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set5_flag = bs_read_u1(b); printf("sps->constraint_set5_flag: %d \n", sps->constraint_set5_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); int reserved_zero_2bits = bs_read_u(b, 2); printf("reserved_zero_2bits: %d \n", reserved_zero_2bits); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->level_idc = bs_read_u8(b); printf("sps->level_idc: %d \n", sps->level_idc); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->seq_parameter_set_id = bs_read_ue(b); printf("sps->seq_parameter_set_id: %d \n", sps->seq_parameter_set_id); 

    if( sps->profile_idc == 100 || sps->profile_idc == 110 ||
        sps->profile_idc == 122 || sps->profile_idc == 244 ||
        sps->profile_idc == 44 || sps->profile_idc == 83 ||
        sps->profile_idc == 86 || sps->profile_idc == 118 ||
        sps->profile_idc == 128 || sps->profile_idc == 138 ||
        sps->profile_idc == 139 || sps->profile_idc == 134
       )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->chroma_format_idc = bs_read_ue(b); printf("sps->chroma_format_idc: %d \n", sps->chroma_format_idc); 
        if( sps->chroma_format_idc == 3 )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->residual_colour_transform_flag = bs_read_u1(b); printf("sps->residual_colour_transform_flag: %d \n", sps->residual_colour_transform_flag); 
        }
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->bit_depth_luma_minus8 = bs_read_ue(b); printf("sps->bit_depth_luma_minus8: %d \n", sps->bit_depth_luma_minus8); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->bit_depth_chroma_minus8 = bs_read_ue(b); printf("sps->bit_depth_chroma_minus8: %d \n", sps->bit_depth_chroma_minus8); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->qpprime_y_zero_transform_bypass_flag = bs_read_u1(b); printf("sps->qpprime_y_zero_transform_bypass_flag: %d \n", sps->qpprime_y_zero_transform_bypass_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->seq_scaling_matrix_present_flag = bs_read_u1(b); printf("sps->seq_scaling_matrix_present_flag: %d \n", sps->seq_scaling_matrix_present_flag); 
        if( sps->seq_scaling_matrix_present_flag )
        {
            for( i = 0; i < 8; i++ )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->seq_scaling_list_present_flag[ i ] = bs_read_u1(b); printf("sps->seq_scaling_list_present_flag[ i ]: %d \n", sps->seq_scaling_list_present_flag[ i ]); 
                if( sps->seq_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_debug_scaling_list( b, sps->ScalingList4x4[ i ], 16,
                                                 &( sps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        read_debug_scaling_list( b, sps->ScalingList8x8[ i - 6 ], 64,
                                                 &( sps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->log2_max_frame_num_minus4 = bs_read_ue(b); printf("sps->log2_max_frame_num_minus4: %d \n", sps->log2_max_frame_num_minus4); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->pic_order_cnt_type = bs_read_ue(b); printf("sps->pic_order_cnt_type: %d \n", sps->pic_order_cnt_type); 
    if( sps->pic_order_cnt_type == 0 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->log2_max_pic_order_cnt_lsb_minus4 = bs_read_ue(b); printf("sps->log2_max_pic_order_cnt_lsb_minus4: %d \n", sps->log2_max_pic_order_cnt_lsb_minus4); 
    }
    else if( sps->pic_order_cnt_type == 1 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->delta_pic_order_always_zero_flag = bs_read_u1(b); printf("sps->delta_pic_order_always_zero_flag: %d \n", sps->delta_pic_order_always_zero_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->offset_for_non_ref_pic = bs_read_se(b); printf("sps->offset_for_non_ref_pic: %d \n", sps->offset_for_non_ref_pic); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->offset_for_top_to_bottom_field = bs_read_se(b); printf("sps->offset_for_top_to_bottom_field: %d \n", sps->offset_for_top_to_bottom_field); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->num_ref_frames_in_pic_order_cnt_cycle = bs_read_ue(b); printf("sps->num_ref_frames_in_pic_order_cnt_cycle: %d \n", sps->num_ref_frames_in_pic_order_cnt_cycle); 
        for( i = 0; i < sps->num_ref_frames_in_pic_order_cnt_cycle; i++ )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->offset_for_ref_frame[ i ] = bs_read_se(b); printf("sps->offset_for_ref_frame[ i ]: %d \n", sps->offset_for_ref_frame[ i ]); 
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->num_ref_frames = bs_read_ue(b); printf("sps->num_ref_frames: %d \n", sps->num_ref_frames); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->gaps_in_frame_num_value_allowed_flag = bs_read_u1(b); printf("sps->gaps_in_frame_num_value_allowed_flag: %d \n", sps->gaps_in_frame_num_value_allowed_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->pic_width_in_mbs_minus1 = bs_read_ue(b); printf("sps->pic_width_in_mbs_minus1: %d \n", sps->pic_width_in_mbs_minus1); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->pic_height_in_map_units_minus1 = bs_read_ue(b); printf("sps->pic_height_in_map_units_minus1: %d \n", sps->pic_height_in_map_units_minus1); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_mbs_only_flag = bs_read_u1(b); printf("sps->frame_mbs_only_flag: %d \n", sps->frame_mbs_only_flag); 
    if( !sps->frame_mbs_only_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->mb_adaptive_frame_field_flag = bs_read_u1(b); printf("sps->mb_adaptive_frame_field_flag: %d \n", sps->mb_adaptive_frame_field_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->direct_8x8_inference_flag = bs_read_u1(b); printf("sps->direct_8x8_inference_flag: %d \n", sps->direct_8x8_inference_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_cropping_flag = bs_read_u1(b); printf("sps->frame_cropping_flag: %d \n", sps->frame_cropping_flag); 
    if( sps->frame_cropping_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_crop_left_offset = bs_read_ue(b); printf("sps->frame_crop_left_offset: %d \n", sps->frame_crop_left_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_crop_right_offset = bs_read_ue(b); printf("sps->frame_crop_right_offset: %d \n", sps->frame_crop_right_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_crop_top_offset = bs_read_ue(b); printf("sps->frame_crop_top_offset: %d \n", sps->frame_crop_top_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_crop_bottom_offset = bs_read_ue(b); printf("sps->frame_crop_bottom_offset: %d \n", sps->frame_crop_bottom_offset); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui_parameters_present_flag = bs_read_u1(b); printf("sps->vui_parameters_present_flag: %d \n", sps->vui_parameters_present_flag); 
    if( sps->vui_parameters_present_flag )
    {
        read_debug_vui_parameters(sps, b);
    }
}